

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxout.cpp
# Opt level: O3

void __thiscall
ConfidentialTxOut_Constractor2_Test::TestBody(ConfidentialTxOut_Constractor2_Test *this)

{
  AssertHelper AVar1;
  undefined8 uVar2;
  bool bVar3;
  AssertHelperData *__dest;
  AssertHelperData *pAVar4;
  undefined1 extraout_DL;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_8;
  ConfidentialTxOutReference txout_ref;
  ConfidentialTxOut txout;
  AssertHelper local_2b8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_2b0;
  undefined1 local_2a8 [24];
  undefined1 local_290 [56];
  AssertHelper local_258;
  AssertHelper AStack_250;
  undefined1 local_248 [24];
  int local_230 [2];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_228;
  undefined1 local_220 [16];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> local_210 [8];
  Script local_208;
  ConfidentialAssetId local_1d0;
  ConfidentialValue local_1a8;
  ConfidentialNonce local_180;
  pointer local_158;
  pointer local_150;
  pointer local_140;
  pointer local_138;
  ConfidentialTxOut local_128 [80];
  ConfidentialAssetId local_d8;
  ConfidentialValue local_b0;
  ConfidentialNonce local_88;
  void *local_60;
  void *local_58;
  void *local_48;
  void *local_40;
  
  cfd::core::ConfidentialTxOut::ConfidentialTxOut
            (local_128,&exp_script,&exp_asset,&exp_value,&exp_nonce,&exp_surjection_proof,
             &exp_range_proof);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_220,&local_d8);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  uVar2 = local_290._0_8_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetAsset().GetHex().c_str()","exp_asset.GetHex().c_str()"
             ,(char *)uVar2,(char *)local_2b8.data_);
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  pAVar4 = (AssertHelperData *)(local_290 + 0x10);
  if ((AssertHelperData *)local_290._0_8_ != pAVar4) {
    operator_delete((void *)local_290._0_8_);
  }
  local_220._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((AssertHelperData *)local_220._8_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_220._8_8_);
  }
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (AStack_250.data_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)AStack_250.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x5f,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_220,&local_b0);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  uVar2 = local_290._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)uVar2,(char *)local_2b8.data_);
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  if ((AssertHelperData *)local_290._0_8_ != pAVar4) {
    operator_delete((void *)local_290._0_8_);
  }
  local_220._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((AssertHelperData *)local_220._8_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_220._8_8_);
  }
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (AStack_250.data_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)AStack_250.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x61,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxOut::GetLockingScript();
  cfd::core::Script::GetHex_abi_cxx11_();
  uVar2 = local_290._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)uVar2,(char *)local_2b8.data_);
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  if ((AssertHelperData *)local_290._0_8_ != pAVar4) {
    operator_delete((void *)local_290._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_220);
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (AStack_250.data_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)AStack_250.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,99,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_220,&local_88);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  uVar2 = local_290._0_8_;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetNonce().GetHex().c_str()","exp_nonce.GetHex().c_str()"
             ,(char *)uVar2,(char *)local_2b8.data_);
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  if ((AssertHelperData *)local_290._0_8_ != pAVar4) {
    operator_delete((void *)local_290._0_8_);
  }
  local_220._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((AssertHelperData *)local_220._8_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_220._8_8_);
  }
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (AStack_250.data_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)AStack_250.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,100,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8.data_ = (AssertHelperData *)0x0;
  sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2a8._0_8_ = 0;
  uVar5 = (long)local_40 - (long)local_48;
  if (uVar5 == 0) {
    __dest = (AssertHelperData *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (AssertHelperData *)operator_new(uVar5);
    sVar7 = (long)local_40 - (long)local_48;
  }
  local_2a8._0_8_ = uVar5 + (long)__dest;
  local_2b8.data_ = __dest;
  if (local_40 != local_48) {
    sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__dest;
    memmove(__dest,local_48,sVar7);
  }
  sStack_2b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&__dest->type + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_220._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)uVar2,(char *)local_290._0_8_);
  if ((AssertHelperData *)local_290._0_8_ != pAVar4) {
    operator_delete((void *)local_290._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_ !=
      local_210) {
    operator_delete((void *)local_220._0_8_);
  }
  if (local_2b8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_2b8.data_);
  }
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (AStack_250.data_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)AStack_250.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x66,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8.data_ = (AssertHelperData *)0x0;
  sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_2a8._0_8_ = 0;
  uVar5 = (long)local_58 - (long)local_60;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar7 = (long)local_58 - (long)local_60;
  }
  local_2a8._0_8_ = uVar5 + (long)pAVar4;
  local_2b8.data_ = pAVar4;
  if (local_58 != local_60) {
    sStack_2b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pAVar4;
    memmove(pAVar4,local_60,sVar7);
  }
  sStack_2b0.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)&pAVar4->type + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_220._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_258,"txout.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)uVar2,(char *)local_290._0_8_);
  if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_ !=
      local_210) {
    operator_delete((void *)local_220._0_8_);
  }
  if (local_2b8.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_2b8.data_);
  }
  if (local_258.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (AStack_250.data_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)AStack_250.data_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x68,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&AStack_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_290._0_8_ = cfd::core::AbstractTxOut::GetValue();
  local_290[8] = extraout_DL;
  local_2b8.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_258.data_ = (AssertHelperData *)((ulong)local_258.data_._4_4_ << 0x20);
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_220,"txout.GetValue().GetSatoshiValue()","0",(long *)&local_2b8,
             (int *)&local_258);
  if ((internal)local_220[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if ((AssertHelperData *)local_220._8_8_ == (AssertHelperData *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_220._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x69,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_220 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOut::GetWitnessHash();
  cfd::core::ByteData256::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_2b8,"txout.GetWitnessHash().GetHex().c_str()",
             "\"51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093\"",
             (char *)local_220._0_8_,
             "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_ !=
      local_210) {
    operator_delete((void *)local_220._0_8_);
  }
  if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_290._0_8_);
  }
  if (local_2b8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_220);
    if (sStack_2b0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((sStack_2b0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x6b,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_290,(Message *)local_220);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_290);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_220._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_2b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxOutReference::ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_220,local_128);
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)local_290,&local_1d0);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  AVar1.data_ = local_2b8.data_;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetAsset().GetHex().c_str()",
             "exp_asset.GetHex().c_str()",(char *)AVar1.data_,(char *)local_258.data_);
  if (local_258.data_ != (AssertHelperData *)local_248) {
    operator_delete(local_258.data_);
  }
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  local_290._0_8_ = &PTR__ConfidentialAssetId_004e1078;
  if ((void *)CONCAT71(local_290._9_7_,local_290[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_290._9_7_,local_290[8]));
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x6f,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)local_290,&local_1a8);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  AVar1.data_ = local_2b8.data_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetConfidentialValue().GetHex().c_str()",
             "exp_value.GetHex().c_str()",(char *)AVar1.data_,(char *)local_258.data_);
  if (local_258.data_ != (AssertHelperData *)local_248) {
    operator_delete(local_258.data_);
  }
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  local_290._0_8_ = &PTR__ConfidentialValue_004e0f10;
  if ((void *)CONCAT71(local_290._9_7_,local_290[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_290._9_7_,local_290[8]));
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x71,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_290,&local_208);
  cfd::core::Script::GetHex_abi_cxx11_();
  AVar1.data_ = local_2b8.data_;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetLockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",(char *)AVar1.data_,(char *)local_258.data_);
  if (local_258.data_ != (AssertHelperData *)local_248) {
    operator_delete(local_258.data_);
  }
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  cfd::core::Script::~Script((Script *)local_290);
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x73,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_290,&local_180);
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  AVar1.data_ = local_2b8.data_;
  cfd::core::ConfidentialNonce::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetNonce().GetHex().c_str()",
             "exp_nonce.GetHex().c_str()",(char *)AVar1.data_,(char *)local_258.data_);
  if (local_258.data_ != (AssertHelperData *)local_248) {
    operator_delete(local_258.data_);
  }
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  local_290._0_8_ = &PTR__ConfidentialNonce_004e1260;
  if ((void *)CONCAT71(local_290._9_7_,local_290[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_290._9_7_,local_290[8]));
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x75,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258.data_ = (AssertHelperData *)0x0;
  AStack_250.data_ = (AssertHelperData *)0x0;
  local_248._0_8_ = 0;
  uVar5 = (long)local_138 - (long)local_140;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar7 = (long)local_138 - (long)local_140;
  }
  local_248._0_8_ = uVar5 + (long)pAVar4;
  local_258.data_ = pAVar4;
  if (local_138 != local_140) {
    AStack_250.data_ = pAVar4;
    memmove(pAVar4,local_140,sVar7);
  }
  AStack_250.data_ = (AssertHelperData *)((long)&pAVar4->type + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_290._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetRangeProof().GetHex().c_str()",
             "exp_range_proof.GetHex().c_str()",(char *)uVar2,(char *)local_2b8.data_);
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_);
  }
  if (local_258.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_258.data_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x77,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_258.data_ = (AssertHelperData *)0x0;
  AStack_250.data_ = (AssertHelperData *)0x0;
  local_248._0_8_ = 0;
  uVar5 = (long)local_150 - (long)local_158;
  if (uVar5 == 0) {
    pAVar4 = (AssertHelperData *)0x0;
    sVar7 = 0;
  }
  else {
    if ((long)uVar5 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar4 = (AssertHelperData *)operator_new(uVar5);
    sVar7 = (long)local_150 - (long)local_158;
  }
  local_248._0_8_ = uVar5 + (long)pAVar4;
  local_258.data_ = pAVar4;
  if (local_150 != local_158) {
    AStack_250.data_ = pAVar4;
    memmove(pAVar4,local_158,sVar7);
  }
  AStack_250.data_ = (AssertHelperData *)((long)&pAVar4->type + sVar7);
  cfd::core::ByteData::GetHex_abi_cxx11_();
  uVar2 = local_290._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_230,"txout_ref.GetSurjectionProof().GetHex().c_str()",
             "exp_surjection_proof.GetHex().c_str()",(char *)uVar2,(char *)local_2b8.data_);
  if (local_2b8.data_ != (AssertHelperData *)local_2a8) {
    operator_delete(local_2b8.data_);
  }
  if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_);
  }
  if (local_258.data_ != (AssertHelperData *)0x0) {
    operator_delete(local_258.data_);
  }
  if (local_230[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_290);
    if (local_228.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((local_228.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x79,pcVar6);
    testing::internal::AssertHelper::operator=(&local_2b8,(Message *)local_290);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    if ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && ((AssertHelperData *)local_290._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(undefined **)local_290._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_228,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_2b8.data_ = (AssertHelperData *)local_220._8_8_;
  sStack_2b0.ptr_._0_1_ = local_210[0];
  local_258.data_ = (AssertHelperData *)cfd::core::Amount::GetSatoshiValue();
  local_230[0] = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_290,"txout_ref.GetValue().GetSatoshiValue()","0",(long *)&local_258,
             local_230);
  if (local_290[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_2b8);
    if ((undefined8 *)CONCAT71(local_290._9_7_,local_290[8]) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_290._9_7_,local_290[8]);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_elements_confidentialtxout.cpp"
               ,0x7a,pcVar6);
    testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_2b8);
    testing::internal::AssertHelper::~AssertHelper(&local_258);
    if (local_2b8.data_ != (AssertHelperData *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) && (local_2b8.data_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_2b8.data_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_290 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference
            ((ConfidentialTxOutReference *)local_220);
  cfd::core::ConfidentialTxOut::~ConfidentialTxOut(local_128);
  return;
}

Assistant:

TEST(ConfidentialTxOut, Constractor2) {
  // Script, ConfidentialAssetId, ConfidentialValue, ConfidentialNonce, ByteData, ByteData
  ConfidentialTxOut txout(exp_script, exp_asset, exp_value, exp_nonce,
                          exp_surjection_proof, exp_range_proof);
  EXPECT_STREQ(txout.GetAsset().GetHex().c_str(), exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout.GetNonce().GetHex().c_str(), exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout.GetValue().GetSatoshiValue(), 0);
  EXPECT_STREQ(txout.GetWitnessHash().GetHex().c_str(),
    "51e1922fa92165e1705155a1973d9c3b78cbc253ec185f58a4d53a59b3eee093");

  ConfidentialTxOutReference txout_ref(txout);
  EXPECT_STREQ(txout_ref.GetAsset().GetHex().c_str(),
               exp_asset.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetConfidentialValue().GetHex().c_str(),
               exp_value.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetLockingScript().GetHex().c_str(),
               exp_script.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetNonce().GetHex().c_str(),
               exp_nonce.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetRangeProof().GetHex().c_str(),
               exp_range_proof.GetHex().c_str());
  EXPECT_STREQ(txout_ref.GetSurjectionProof().GetHex().c_str(),
               exp_surjection_proof.GetHex().c_str());
  EXPECT_EQ(txout_ref.GetValue().GetSatoshiValue(), 0);
}